

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ftp.c
# Opt level: O1

CURLcode ftp_state_get_resp(Curl_easy *data,int ftpcode,ftpstate instate)

{
  byte *pbVar1;
  connectdata *pcVar2;
  FTP *pFVar3;
  long lVar4;
  CURLcode CVar5;
  char *pcVar6;
  char *pcVar7;
  char *pcVar8;
  connectdata *conn;
  _Bool connected;
  curl_off_t size;
  _Bool local_29;
  curl_off_t local_28;
  
  pcVar2 = data->conn;
  pFVar3 = (data->req).p.ftp;
  if ((ftpcode == 0x96) || (ftpcode == 0x7d)) {
    local_28 = -1;
    if ((instate == '\x1f') ||
       (((((data->state).field_0x74d & 0x40) != 0 || (((data->set).field_0x8be & 4) != 0)) ||
        (0 < pFVar3->downloadsize)))) {
      if (-1 < pFVar3->downloadsize) {
        local_28 = pFVar3->downloadsize;
      }
    }
    else {
      pcVar6 = Curl_dyn_ptr(&(pcVar2->proto).ftpc.pp.recvbuf);
      pcVar7 = strstr(pcVar6," bytes");
      if (pcVar7 != (char *)0x0) {
        pcVar8 = pcVar7 + -1;
        if (pcVar8 + ~(ulong)pcVar6 != (char *)0x0) {
          pcVar6 = pcVar6 + (2 - (long)pcVar7);
          do {
            if (*pcVar8 == '(') break;
            if (9 < (byte)(*pcVar8 - 0x30U)) {
              pcVar8 = (char *)0x0;
              break;
            }
            pcVar8 = pcVar8 + -1;
            pcVar6 = pcVar6 + 1;
          } while (pcVar6 != (char *)0x0);
        }
        if (pcVar8 != (char *)0x0) {
          curlx_strtoofft(pcVar8 + 1,(char **)0x0,10,&local_28);
        }
      }
    }
    lVar4 = (data->req).maxdownload;
    if (lVar4 < 1 || local_28 <= lVar4) {
      if ((instate != '\x1f') && (((data->state).field_0x74d & 0x40) != 0)) {
        local_28 = -1;
      }
    }
    else {
      (data->req).size = lVar4;
      local_28 = lVar4;
    }
    if ((data != (Curl_easy *)0x0) && (((data->set).field_0x8bd & 0x10) != 0)) {
      Curl_infof(data,"Maxdownload = %ld");
    }
    if ((instate != '\x1f' && data != (Curl_easy *)0x0) && (((data->set).field_0x8bd & 0x10) != 0))
    {
      Curl_infof(data,"Getting file with size: %ld",local_28);
    }
    (pcVar2->proto).ftpc.state_saved = instate;
    (pcVar2->proto).ftpc.retr_size_saved = local_28;
    if (((data->set).field_0x8bb & 0x10) == 0) {
      CVar5 = InitiateTransfer(data);
    }
    else {
      CVar5 = AllowServerConnect(data,&local_29);
      if ((CVar5 == CURLE_OK) && (local_29 == false)) {
        if ((data != (Curl_easy *)0x0) && (((data->set).field_0x8bd & 0x10) != 0)) {
          Curl_infof(data,"Data conn was not available immediately");
        }
        (data->conn->proto).ftpc.state = '\0';
        pbVar1 = (byte *)((long)&pcVar2->proto + 0x112);
        *pbVar1 = *pbVar1 | 0x20;
      }
    }
  }
  else if (ftpcode == 0x1c2 && instate == '\x1f') {
    pFVar3->transfer = PPTRANSFER_NONE;
    (pcVar2->proto).ftpc.state = '\0';
    CVar5 = CURLE_OK;
  }
  else {
    Curl_failf(data,"RETR response: %03d",(ulong)(uint)ftpcode);
    CVar5 = CURLE_REMOTE_FILE_NOT_FOUND;
    if (instate != ' ') {
      CVar5 = CURLE_FTP_COULDNT_RETR_FILE;
    }
    if (ftpcode != 0x226) {
      CVar5 = CURLE_FTP_COULDNT_RETR_FILE;
    }
  }
  return CVar5;
}

Assistant:

static CURLcode ftp_state_get_resp(struct Curl_easy *data,
                                   int ftpcode,
                                   ftpstate instate)
{
  CURLcode result = CURLE_OK;
  struct FTP *ftp = data->req.p.ftp;
  struct connectdata *conn = data->conn;

  if((ftpcode == 150) || (ftpcode == 125)) {

    /*
      A;
      150 Opening BINARY mode data connection for /etc/passwd (2241
      bytes).  (ok, the file is being transferred)

      B:
      150 Opening ASCII mode data connection for /bin/ls

      C:
      150 ASCII data connection for /bin/ls (137.167.104.91,37445) (0 bytes).

      D:
      150 Opening ASCII mode data connection for [file] (0.0.0.0,0) (545 bytes)

      E:
      125 Data connection already open; Transfer starting. */

    curl_off_t size = -1; /* default unknown size */


    /*
     * It appears that there are FTP-servers that return size 0 for files when
     * SIZE is used on the file while being in BINARY mode. To work around
     * that (stupid) behavior, we attempt to parse the RETR response even if
     * the SIZE returned size zero.
     *
     * Debugging help from Salvatore Sorrentino on February 26, 2003.
     */

    if((instate != FTP_LIST) &&
       !data->state.prefer_ascii &&
       !data->set.ignorecl &&
       (ftp->downloadsize < 1)) {
      /*
       * It seems directory listings either don't show the size or very
       * often uses size 0 anyway. ASCII transfers may very well turn out
       * that the transferred amount of data is not the same as this line
       * tells, why using this number in those cases only confuses us.
       *
       * Example D above makes this parsing a little tricky */
      char *bytes;
      char *buf = Curl_dyn_ptr(&conn->proto.ftpc.pp.recvbuf);
      bytes = strstr(buf, " bytes");
      if(bytes) {
        long in = (long)(--bytes-buf);
        /* this is a hint there is size information in there! ;-) */
        while(--in) {
          /* scan for the left parenthesis and break there */
          if('(' == *bytes)
            break;
          /* skip only digits */
          if(!ISDIGIT(*bytes)) {
            bytes = NULL;
            break;
          }
          /* one more estep backwards */
          bytes--;
        }
        /* if we have nothing but digits: */
        if(bytes) {
          ++bytes;
          /* get the number! */
          (void)curlx_strtoofft(bytes, NULL, 10, &size);
        }
      }
    }
    else if(ftp->downloadsize > -1)
      size = ftp->downloadsize;

    if(size > data->req.maxdownload && data->req.maxdownload > 0)
      size = data->req.size = data->req.maxdownload;
    else if((instate != FTP_LIST) && (data->state.prefer_ascii))
      size = -1; /* kludge for servers that understate ASCII mode file size */

    infof(data, "Maxdownload = %" CURL_FORMAT_CURL_OFF_T,
          data->req.maxdownload);

    if(instate != FTP_LIST)
      infof(data, "Getting file with size: %" CURL_FORMAT_CURL_OFF_T,
            size);

    /* FTP download: */
    conn->proto.ftpc.state_saved = instate;
    conn->proto.ftpc.retr_size_saved = size;

    if(data->set.ftp_use_port) {
      bool connected;

      result = AllowServerConnect(data, &connected);
      if(result)
        return result;

      if(!connected) {
        struct ftp_conn *ftpc = &conn->proto.ftpc;
        infof(data, "Data conn was not available immediately");
        ftp_state(data, FTP_STOP);
        ftpc->wait_data_conn = TRUE;
      }
    }
    else
      return InitiateTransfer(data);
  }
  else {
    if((instate == FTP_LIST) && (ftpcode == 450)) {
      /* simply no matching files in the dir listing */
      ftp->transfer = PPTRANSFER_NONE; /* don't download anything */
      ftp_state(data, FTP_STOP); /* this phase is over */
    }
    else {
      failf(data, "RETR response: %03d", ftpcode);
      return instate == FTP_RETR && ftpcode == 550?
        CURLE_REMOTE_FILE_NOT_FOUND:
        CURLE_FTP_COULDNT_RETR_FILE;
    }
  }

  return result;
}